

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O0

void recall_tree_ns::compute_recall_lbest(recall_tree *b,node *n)

{
  float fVar1;
  node_pred *pnVar2;
  node_pred *pnVar3;
  node_pred **ppnVar4;
  float *pfVar5;
  long in_RSI;
  long in_RDI;
  bool bVar6;
  float fVar7;
  double dVar8;
  float diamf;
  float stdf;
  float f;
  node_pred *ls;
  double mass_at_k;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  node_pred *local_20;
  double local_18;
  long local_10;
  long local_8;
  
  if (0.0 < *(double *)(in_RSI + 0x20)) {
    local_18 = 0.0;
    local_10 = in_RSI;
    local_8 = in_RDI;
    ppnVar4 = v_array<recall_tree_ns::node_pred>::begin
                        ((v_array<recall_tree_ns::node_pred> *)(in_RSI + 0x38));
    local_20 = *ppnVar4;
    while( true ) {
      pnVar2 = local_20;
      ppnVar4 = v_array<recall_tree_ns::node_pred>::end
                          ((v_array<recall_tree_ns::node_pred> *)(local_10 + 0x38));
      pnVar3 = local_20;
      bVar6 = false;
      if (pnVar2 != *ppnVar4) {
        ppnVar4 = v_array<recall_tree_ns::node_pred>::begin
                            ((v_array<recall_tree_ns::node_pred> *)(local_10 + 0x38));
        bVar6 = pnVar3 < *ppnVar4 + *(long *)(local_8 + 0x30);
      }
      if (!bVar6) break;
      local_18 = local_20->label_count + local_18;
      local_20 = local_20 + 1;
    }
    local_24 = (float)local_18 / (float)*(double *)(local_10 + 0x20);
    dVar8 = std::sqrt((double)(ulong)(uint)((local_24 * (1.0 - local_24)) /
                                           (float)*(double *)(local_10 + 0x20)));
    local_28 = SUB84(dVar8,0);
    fVar7 = sqrtf(18.0);
    fVar1 = local_24;
    local_2c = 15.0 / (fVar7 * (float)*(double *)(local_10 + 0x20));
    local_30 = 0.0;
    dVar8 = std::sqrt((double)(ulong)*(uint *)(local_8 + 0x48));
    local_34 = -*(float *)(local_8 + 0x48) * local_2c + -SUB84(dVar8,0) * local_28 + fVar1;
    pfVar5 = std::max<float>(&local_30,&local_34);
    *(float *)(local_10 + 4) = *pfVar5;
  }
  return;
}

Assistant:

void compute_recall_lbest(recall_tree& b, node* n)
{
  if (n->n <= 0)
    return;

  double mass_at_k = 0;

  for (node_pred* ls = n->preds.begin(); ls != n->preds.end() && ls < n->preds.begin() + b.max_candidates; ++ls)
  {
    mass_at_k += ls->label_count;
  }

  float f = (float)mass_at_k / (float)n->n;
  float stdf = sqrt(f * (1.f - f) / (float)n->n);
  float diamf = 15.f / (sqrtf(18.f) * (float)n->n);

  // http://stackoverflow.com/questions/2789481/problem-calling-stdmax
  n->recall_lbest = (std::max)(0.f, f - sqrt(b.bern_hyper) * stdf - b.bern_hyper * diamf);
}